

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

string * __thiscall adios2::Engine::Type_abi_cxx11_(string *__return_storage_ptr__,Engine *this)

{
  Engine *pEVar1;
  long lVar2;
  string local_48;
  
  pEVar1 = this->m_Engine;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"in call to Engine::Type","");
  helper::CheckForNullptr<adios2::core::Engine>(pEVar1,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pEVar1 = this->m_Engine;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)(pEVar1 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,*(long *)(pEVar1 + 0x10) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Engine::Type() const
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Type");
    return m_Engine->m_EngineType;
}